

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O3

void __thiscall Wall::do_finish(Wall *this,actor_ref *param_1,msg_finish *param_2)

{
  size_t sVar1;
  msg_wrap_t<msg_out> *this_00;
  char buffer [255];
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char local_118 [256];
  
  this->m_finished = true;
  snprintf(local_118,0xff,"Counter : %d",(ulong)(uint)this->m_counter);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  sVar1 = strlen(local_118);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,local_118,local_118 + sVar1);
  if ((this->m_console).object_ != (object_t *)0x0) {
    this_00 = (msg_wrap_t<msg_out> *)operator_new(0x40);
    acto::core::msg_wrap_t<msg_out>::msg_wrap_t<std::__cxx11::string>(this_00,&local_138);
    local_140._M_head_impl = (msg_t *)this_00;
    acto::actor_ref::send_message
              (&this->m_console,
               (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&local_140)
    ;
    if ((msg_wrap_t<msg_out> *)local_140._M_head_impl != (msg_wrap_t<msg_out> *)0x0) {
      (*((msg_t *)&(local_140._M_head_impl)->_vptr_msg_t)->_vptr_msg_t[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  acto::actor::die(&this->super_actor);
  return;
}

Assistant:

void do_finish(acto::actor_ref, const msg_finish&) {
    m_finished = true;
    // -
    char    buffer[255];

    std::snprintf(buffer, sizeof(buffer), "Counter : %d", (int)m_counter);
    // Отправить сообщение на консоль
    m_console.send< msg_out >(std::string(buffer));
    // Завершить выполнение текущего актера
    this->die();
  }